

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true>_>_>
::_initialize_U(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true>_>_>
                *this)

{
  uint uVar1;
  Index IVar2;
  pair<unsigned_int,_unsigned_int> local_38;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_30;
  uint local_1c;
  uint uStack_18;
  ID_index i;
  type id;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true>_>_>
  *this_local;
  
  id = (type)this;
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
            ((pair<unsigned_int,_unsigned_int> *)&stack0xffffffffffffffe8);
  i = 1;
  local_1c = 0;
  while( true ) {
    uVar1 = local_1c;
    IVar2 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true>_>_>
            ::get_number_of_columns(&this->reducedMatrixR_);
    if (IVar2 <= uVar1) break;
    uStack_18 = local_1c;
    local_38.second = i;
    local_38.first = local_1c;
    local_30._M_array = &local_38;
    local_30._M_len = 1;
    Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,true>>>
    ::insert_column<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
              ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,true>>>
                *)&this->mirrorMatrixU_,&local_30);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_initialize_U()
{
  typename std::conditional<Master_matrix::Option_list::is_z2, Index, std::pair<Index, Field_element> >::type id;
  if constexpr (!Master_matrix::Option_list::is_z2) id.second = 1;

  for (ID_index i = 0; i < reducedMatrixR_.get_number_of_columns(); i++) {
    if constexpr (Master_matrix::Option_list::is_z2)
      id = i;
    else
      id.first = i;
    mirrorMatrixU_.insert_column({id});
  }
}